

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O2

void __thiscall MeCab::anon_unknown_0::TaggerImpl::TaggerImpl(TaggerImpl *this)

{
  (this->super_Tagger)._vptr_Tagger = (_func_int **)&PTR_parse_00139570;
  this->current_model_ = (ModelImpl *)0x0;
  (this->model_)._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_00139858;
  (this->model_).ptr_ = (ModelImpl *)0x0;
  (this->lattice_)._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_00139898;
  (this->lattice_).ptr_ = (Lattice *)0x0;
  this->request_type_ = 1;
  this->theta_ = 0.75;
  (this->what_)._M_dataplus._M_p = (pointer)&(this->what_).field_2;
  (this->what_)._M_string_length = 0;
  (this->what_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

TaggerImpl::TaggerImpl()
    : current_model_(0),
      request_type_(MECAB_ONE_BEST), theta_(kDefaultTheta) {}